

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmExgAxAy<(moira::Instr)63,(moira::Mode)12,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  StrWriter *this_00;
  
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Align)(this->tab).raw);
  pcVar1 = this_00->ptr;
  this_00->ptr = pcVar1 + 1;
  *pcVar1 = 'A';
  pbVar2 = (byte *)this_00->ptr;
  this_00->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (byte)(op >> 9) & 7 | 0x30;
  StrWriter::operator<<(this_00,", ");
  pcVar1 = this_00->ptr;
  this_00->ptr = pcVar1 + 1;
  *pcVar1 = 'A';
  pbVar2 = (byte *)this_00->ptr;
  this_00->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (byte)op & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmExgAxAy(StrWriter &str, u32 &addr, u16 op)
{
    auto src = An ( ____xxx_________(op) );
    auto dst = An ( _____________xxx(op) );

    str << Ins<I>{} << tab << src << ", " << dst;
}